

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O2

int check_vector(N_Vector x,N_Vector y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  prVar1 = N_VGetArrayPointer(x);
  prVar2 = N_VGetArrayPointer(y);
  uVar3 = N_VGetLength_Serial(x);
  uVar4 = N_VGetLength_Serial(y);
  if (uVar3 == uVar4) {
    uVar4 = 0;
    if ((long)uVar3 < 1) {
      uVar3 = uVar4;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar6 = 1;
      if (!NAN(prVar1[uVar5])) {
        uVar6 = (uint)(tol < ABS((prVar1[uVar5] - prVar2[uVar5]) / prVar2[uVar5]));
      }
      uVar4 = (ulong)((int)uVar4 + uVar6);
    }
    uVar6 = (uint)((int)uVar4 != 0);
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, realtype tol)
{
  int failure = 0;
  realtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength_Serial(x);
  yldata = N_VGetLength_Serial(y);

  if (xldata != yldata) {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return(1);
  }

  /* check vector data */
  for(i=0; i < xldata; i++){
    failure += FNEQ(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO)
    return(1);
  else
    return(0);
}